

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O1

CheckStreamRez * __thiscall
H264StreamReader::checkStream
          (CheckStreamRez *__return_storage_ptr__,H264StreamReader *this,uint8_t *buffer,int len)

{
  string *psVar1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_header *p_Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  byte bVar5;
  undefined1 uVar6;
  undefined1 uVar8;
  uint uVar7;
  undefined2 uVar9;
  _Alloc_hider _Var10;
  bool bVar11;
  int iVar12;
  int iVar13;
  byte *buffer_00;
  uint8_t *end;
  undefined8 uVar14;
  undefined8 extraout_RAX;
  long *plVar15;
  SPSUnit *pSVar16;
  _Base_ptr p_Var17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  uint uVar23;
  uint8_t *puVar19;
  size_type *psVar20;
  _Base_ptr p_Var21;
  _Rb_tree_header *p_Var22;
  ulong uVar24;
  bool bVar25;
  string tmpDescr;
  uint8_t tmpBuffer [512];
  SliceUnit slice;
  SEIUnit lastSEI;
  undefined1 *local_4f8;
  long local_4f0;
  undefined1 local_4e8;
  undefined7 uStack_4e7;
  ulong local_4d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4d0;
  ulong local_4c8;
  string *local_4c0;
  string *local_4b8;
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,PPSUnit*>,std::_Select1st<std::pair<unsigned_int_const,PPSUnit*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,PPSUnit*>>>
  *local_4b0;
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,SPSUnit*>,std::_Select1st<std::pair<unsigned_int_const,SPSUnit*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,SPSUnit*>>>
  *local_4a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_498;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_490;
  uint8_t *local_488;
  byte *local_480;
  string local_478;
  string local_458 [16];
  SliceUnit local_250;
  SEIUnit local_1d0;
  
  local_1d0.m_processedMessages._M_h._M_buckets =
       &local_1d0.m_processedMessages._M_h._M_single_bucket;
  local_1d0.super_NALUnit.bitReader.super_BitStream.m_totalBits = 0;
  local_1d0.super_NALUnit.bitReader.super_BitStream.m_buffer = (uint *)0x0;
  local_1d0.super_NALUnit.bitReader.super_BitStream.m_initBuffer = (uint *)0x0;
  local_1d0.super_NALUnit.bitReader.m_curVal = 0;
  local_1d0.super_NALUnit.bitReader.m_bitLeft = 0;
  local_1d0.super_NALUnit.nal_unit_type = nuUnspecified;
  local_1d0.super_NALUnit.nal_ref_idc = 0;
  local_1d0.super_NALUnit.m_nalBuffer = (uint8_t *)0x0;
  local_1d0.super_NALUnit.m_nalBufferLen = 0;
  local_1d0.super_NALUnit._vptr_NALUnit = (_func_int **)&PTR__SEIUnit_002404a0;
  local_1d0.pic_struct = '\0';
  local_1d0.m_processedMessages._M_h._M_bucket_count = 1;
  local_1d0.m_processedMessages._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1d0.m_processedMessages._M_h._M_element_count = 0;
  local_1d0.m_processedMessages._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  memset(&local_1d0.m_processedMessages._M_h._M_rehash_policy._M_next_resize,0,0x118);
  local_1d0.number_of_offset_sequences = -1;
  local_1d0.metadataPtsOffset = 0;
  local_1d0.m_mvcHeaderLen = 0;
  local_1d0.m_mvcHeaderStart = (uint8_t *)0x0;
  SliceUnit::SliceUnit(&local_250);
  (__return_storage_ptr__->codecInfo).codecID = 0;
  local_4d0 = &(__return_storage_ptr__->codecInfo).displayName.field_2;
  (__return_storage_ptr__->codecInfo).displayName._M_dataplus._M_p = (pointer)local_4d0;
  (__return_storage_ptr__->codecInfo).displayName._M_string_length = 0;
  (__return_storage_ptr__->codecInfo).displayName.field_2._M_local_buf[0] = '\0';
  local_490 = &(__return_storage_ptr__->codecInfo).programName.field_2;
  (__return_storage_ptr__->codecInfo).programName._M_dataplus._M_p = (pointer)local_490;
  (__return_storage_ptr__->codecInfo).programName._M_string_length = 0;
  (__return_storage_ptr__->codecInfo).programName.field_2._M_local_buf[0] = '\0';
  local_498 = &(__return_storage_ptr__->streamDescr).field_2;
  (__return_storage_ptr__->streamDescr)._M_dataplus._M_p = (pointer)local_498;
  (__return_storage_ptr__->streamDescr)._M_string_length = 0;
  (__return_storage_ptr__->streamDescr).field_2._M_local_buf[0] = '\0';
  local_4a0 = &(__return_storage_ptr__->lang).field_2;
  (__return_storage_ptr__->lang)._M_dataplus._M_p = (pointer)local_4a0;
  (__return_storage_ptr__->lang)._M_string_length = 0;
  (__return_storage_ptr__->lang).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->trackID = 0;
  *(undefined4 *)((long)&__return_storage_ptr__->delay + 7) = 0;
  __return_storage_ptr__->delay = 0;
  puVar19 = buffer + len;
  local_4f8 = &local_4e8;
  local_4f0 = 0;
  local_4e8 = 0;
  buffer_00 = NALUnit::findNextNAL(buffer,puVar19);
  psVar1 = &(__return_storage_ptr__->codecInfo).displayName;
  local_4b8 = (string *)&(__return_storage_ptr__->codecInfo).programName;
  local_4c0 = (string *)&__return_storage_ptr__->streamDescr;
  local_480 = puVar19 + -4;
  paVar4 = &local_458[0].field_2;
  p_Var2 = &(this->m_spsMap)._M_t._M_impl.super__Rb_tree_header;
  local_4b0 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,PPSUnit*>,std::_Select1st<std::pair<unsigned_int_const,PPSUnit*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,PPSUnit*>>>
               *)&this->m_ppsMap;
  p_Var3 = &(this->m_ppsMap)._M_t._M_impl.super__Rb_tree_header;
  local_4a8 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,SPSUnit*>,std::_Select1st<std::pair<unsigned_int_const,SPSUnit*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,SPSUnit*>>>
               *)&this->m_spsMap;
  local_4c8 = 0;
  local_4d8 = 0;
  bVar11 = false;
  local_488 = puVar19;
  do {
    if (local_480 <= buffer_00) {
      iVar12 = 2;
LAB_00185b2d:
      if (iVar12 == 2) {
        if ((this->m_mvcSubStream == true) && (this->m_mvcPrimaryStream == true)) {
          __return_storage_ptr__->multiSubStream = true;
        }
        if (local_4f8 != &local_4e8) {
          operator_delete(local_4f8,CONCAT71(uStack_4e7,local_4e8) + 1);
        }
      }
      else {
        if (local_4f8 != &local_4e8) {
          operator_delete(local_4f8,CONCAT71(uStack_4e7,local_4e8) + 1);
        }
        if (!bVar11) {
          plVar15 = (long *)(__return_storage_ptr__->lang)._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar15 != local_4a0) {
            operator_delete(plVar15,local_4a0->_M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*(long **)local_4c0 != local_498) {
            operator_delete(*(long **)local_4c0,local_498->_M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*(long **)local_4b8 != local_490) {
            operator_delete(*(long **)local_4b8,local_490->_M_allocated_capacity + 1);
          }
          plVar15 = (long *)(psVar1->_M_dataplus)._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar15 != local_4d0) {
            operator_delete(plVar15,local_4d0->_M_allocated_capacity + 1);
          }
        }
      }
      local_250.super_NALUnit._vptr_NALUnit = (_func_int **)&PTR__NALUnit_00242058;
      if (local_250.super_NALUnit.m_nalBuffer != (uint8_t *)0x0) {
        operator_delete__(local_250.super_NALUnit.m_nalBuffer);
      }
      SEIUnit::~SEIUnit(&local_1d0);
      return __return_storage_ptr__;
    }
    bVar5 = *buffer_00;
    if ((char)bVar5 < '\0') {
      bVar11 = true;
      iVar12 = 1;
      goto LAB_00185b2d;
    }
    end = NALUnit::findNALWithStartCode(buffer_00,puVar19,true);
    if ((end == puVar19) && (iVar12 = 2, (this->super_MPEGStreamReader).m_eof == false))
    goto LAB_00185998;
    switch(bVar5 & 0x1f) {
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 0x14:
      if (((this->m_ppsMap)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
         ((this->m_spsMap)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0))
      goto switchD_0018550f_caseD_9;
      uVar24 = (long)end - (long)buffer_00;
      if (0x1f7 < uVar24) {
        uVar24 = 0x1f8;
      }
      iVar12 = NALUnit::decodeNAL(buffer_00,buffer_00 + uVar24,(uint8_t *)local_458,0x200);
      iVar13 = SliceUnit::deserialize
                         (&local_250,(uint8_t *)local_458,
                          (uint8_t *)((long)&local_458[0]._M_dataplus._M_p + (long)iVar12),
                          (map<unsigned_int,_SPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SPSUnit_*>_>_>
                           *)local_4a8,
                          (map<unsigned_int,_PPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_PPSUnit_*>_>_>
                           *)local_4b0);
      bVar25 = true;
      if (iVar13 == 0) {
        if (this->m_mvcSubStream == true) {
          (__return_storage_ptr__->codecInfo).codecID = ::h264DepCodecInfo.codecID;
          std::__cxx11::string::_M_assign((string *)psVar1);
        }
        else {
          (__return_storage_ptr__->codecInfo).codecID = ::h264CodecInfo.codecID;
          std::__cxx11::string::_M_assign((string *)psVar1);
        }
        std::__cxx11::string::_M_assign(local_4b8);
        std::__cxx11::string::_M_assign(local_4c0);
        bVar25 = bVar11;
      }
      iVar12 = 1;
      bVar11 = bVar25;
      goto LAB_00185991;
    case 6:
      if ((this->m_spsMap)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        pSVar16 = (SPSUnit *)
                  (this->m_spsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent
        ;
        NALUnit::decodeBuffer(&local_1d0.super_NALUnit,buffer_00,end);
        uVar23 = 1;
        if ((pSVar16->nalHrdParams).isPresent == false) {
          uVar23 = (uint)(pSVar16->vclHrdParams).isPresent;
        }
        SEIUnit::deserialize(&local_1d0,pSVar16,uVar23);
        if (((byte)(local_1d0.pic_struct - 5U) < 4) && ((local_4d8 & 1) == 0)) {
          SPSUnit::getStreamDescr_abi_cxx11_(local_458,pSVar16);
          uVar14 = std::__cxx11::string::operator=((string *)&local_4f8,(string *)local_458);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_458[0]._M_dataplus._M_p != paVar4) {
            operator_delete(local_458[0]._M_dataplus._M_p,
                            local_458[0].field_2._M_allocated_capacity + 1);
            uVar14 = extraout_RAX;
          }
          local_4d8 = CONCAT71((int7)((ulong)uVar14 >> 8),1);
          std::__cxx11::string::append((char *)&local_4f8);
        }
        if (((local_4c8 & 1) == 0) && (-1 < local_1d0.number_of_offset_sequences)) {
          int32ToStr_abi_cxx11_(&local_478,&local_1d0.number_of_offset_sequences);
          plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_478,0,(char *)0x0,0x2074ac);
          psVar20 = (size_type *)(plVar15 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar20) {
            local_458[0].field_2._0_8_ = *psVar20;
            local_458[0].field_2._8_8_ = plVar15[3];
            local_458[0]._M_dataplus._M_p = (pointer)paVar4;
          }
          else {
            local_458[0].field_2._0_8_ = *psVar20;
            local_458[0]._M_dataplus._M_p = (pointer)*plVar15;
          }
          local_458[0]._M_string_length = plVar15[1];
          *plVar15 = (long)psVar20;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_4f8,(ulong)local_458[0]._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_458[0]._M_dataplus._M_p != paVar4) {
            operator_delete(local_458[0]._M_dataplus._M_p,
                            local_458[0].field_2._M_allocated_capacity + 1);
          }
          paVar18 = &local_478.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_478._M_dataplus._M_p != paVar18) {
            operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
            paVar18 = extraout_RAX_00;
          }
          local_4c8 = CONCAT71((int7)((ulong)paVar18 >> 8),1);
        }
      }
    default:
switchD_0018550f_caseD_9:
      iVar12 = 0;
      break;
    case 7:
      this->m_mvcPrimaryStream = true;
      goto LAB_00185725;
    case 8:
      pSVar16 = (SPSUnit *)operator_new(0x58);
      (pSVar16->super_NALUnit).bitReader.super_BitStream.m_totalBits = 0;
      (pSVar16->super_NALUnit).bitReader.super_BitStream.m_buffer = (uint *)0x0;
      (pSVar16->super_NALUnit).bitReader.super_BitStream.m_initBuffer = (uint *)0x0;
      (pSVar16->super_NALUnit).bitReader.m_curVal = 0;
      (pSVar16->super_NALUnit).bitReader.m_bitLeft = 0;
      (pSVar16->super_NALUnit).nal_unit_type = nuUnspecified;
      (pSVar16->super_NALUnit).nal_ref_idc = 0;
      (pSVar16->super_NALUnit).m_nalBuffer = (uint8_t *)0x0;
      (pSVar16->super_NALUnit).m_nalBufferLen = 0;
      (pSVar16->super_NALUnit)._vptr_NALUnit = (_func_int **)&PTR__NALUnit_00240450;
      pSVar16->m_ready = false;
      pSVar16->field_0x41 = 0;
      pSVar16->sar_width = 0;
      pSVar16->sar_height = 0;
      *(undefined2 *)&pSVar16->field_0x46 = 0;
      pSVar16->num_units_in_tick = 1;
      pSVar16->time_scale = 1;
      *(undefined1 *)&pSVar16->fixed_frame_rate_flag = 0;
      NALUnit::decodeBuffer((NALUnit *)pSVar16,buffer_00,end);
      iVar13 = PPSUnit::deserialize((PPSUnit *)pSVar16);
      _Var10._M_p = local_458[0]._M_dataplus._M_p;
      if (iVar13 == 0) {
        p_Var21 = (this->m_spsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var17 = &p_Var2->_M_header;
        if (p_Var21 != (_Base_ptr)0x0) {
          do {
            bVar25 = (uint)*(size_t *)(p_Var21 + 1) < *(uint *)&pSVar16->sar_height;
            if (!bVar25) {
              p_Var17 = p_Var21;
            }
            p_Var21 = (&p_Var21->_M_left)[bVar25];
          } while (p_Var21 != (_Base_ptr)0x0);
        }
        p_Var22 = p_Var2;
        if (((_Rb_tree_header *)p_Var17 != p_Var2) &&
           (p_Var22 = (_Rb_tree_header *)p_Var17,
           *(uint *)&pSVar16->sar_height < (uint)((_Rb_tree_header *)p_Var17)->_M_node_count)) {
          p_Var22 = p_Var2;
        }
        if (p_Var22 == p_Var2) {
LAB_00185968:
          (pSVar16->super_NALUnit)._vptr_NALUnit = (_func_int **)&PTR__NALUnit_00242058;
          puVar19 = (pSVar16->super_NALUnit).m_nalBuffer;
          if (puVar19 != (uint8_t *)0x0) {
            operator_delete__(puVar19);
          }
          uVar24 = 0x58;
          goto LAB_00185984;
        }
        p_Var21 = (this->m_ppsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var17 = &p_Var3->_M_header;
        if (p_Var21 != (_Base_ptr)0x0) {
          uVar23._0_1_ = pSVar16->m_ready;
          uVar23._1_1_ = pSVar16->field_0x41;
          uVar23._2_2_ = pSVar16->sar_width;
          do {
            bVar25 = (uint)*(size_t *)(p_Var21 + 1) < uVar23;
            if (!bVar25) {
              p_Var17 = p_Var21;
            }
            p_Var21 = (&p_Var21->_M_left)[bVar25];
          } while (p_Var21 != (_Base_ptr)0x0);
        }
        p_Var22 = p_Var3;
        if (((_Rb_tree_header *)p_Var17 != p_Var3) &&
           (uVar7._0_1_ = pSVar16->m_ready, uVar7._1_1_ = pSVar16->field_0x41,
           uVar7._2_2_ = pSVar16->sar_width, p_Var22 = (_Rb_tree_header *)p_Var17,
           uVar7 < (uint)((_Rb_tree_header *)p_Var17)->_M_node_count)) {
          p_Var22 = p_Var3;
        }
        if (p_Var22 != p_Var3) goto LAB_00185968;
        uVar6 = pSVar16->m_ready;
        uVar8 = pSVar16->field_0x41;
        uVar9 = pSVar16->sar_width;
        local_458[0]._M_dataplus._M_p._2_2_ = uVar9;
        local_458[0]._M_dataplus._M_p._1_1_ = uVar8;
        local_458[0]._M_dataplus._M_p._0_1_ = uVar6;
        local_458[0]._M_dataplus._M_p._4_4_ = SUB84(_Var10._M_p,4);
        local_458[0]._M_string_length = (size_type)pSVar16;
        std::
        _Rb_tree<unsigned_int,std::pair<unsigned_int_const,PPSUnit*>,std::_Select1st<std::pair<unsigned_int_const,PPSUnit*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,PPSUnit*>>>
        ::_M_emplace_unique<std::pair<unsigned_int,PPSUnit*>>
                  (local_4b0,(pair<unsigned_int,_PPSUnit_*> *)local_458);
        goto LAB_0018598c;
      }
      (pSVar16->super_NALUnit)._vptr_NALUnit = (_func_int **)&PTR__NALUnit_00242058;
      puVar19 = (pSVar16->super_NALUnit).m_nalBuffer;
      if (puVar19 != (uint8_t *)0x0) {
        operator_delete__(puVar19);
      }
      uVar24 = 0x58;
      goto LAB_001857f6;
    case 0xf:
      this->m_mvcSubStream = true;
LAB_00185725:
      pSVar16 = (SPSUnit *)operator_new(0x200);
      SPSUnit::SPSUnit(pSVar16);
      NALUnit::decodeBuffer((NALUnit *)pSVar16,buffer_00,end);
      iVar13 = SPSUnit::deserialize(pSVar16);
      if (iVar13 == 0) {
        p_Var21 = (this->m_spsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var17 = &p_Var2->_M_header;
        if (p_Var21 != (_Base_ptr)0x0) {
          do {
            bVar25 = (uint)*(size_t *)(p_Var21 + 1) < pSVar16->seq_parameter_set_id;
            if (!bVar25) {
              p_Var17 = p_Var21;
            }
            p_Var21 = (&p_Var21->_M_left)[bVar25];
          } while (p_Var21 != (_Base_ptr)0x0);
        }
        p_Var22 = p_Var2;
        if (((_Rb_tree_header *)p_Var17 != p_Var2) &&
           (p_Var22 = (_Rb_tree_header *)p_Var17,
           pSVar16->seq_parameter_set_id < (uint)((_Rb_tree_header *)p_Var17)->_M_node_count)) {
          p_Var22 = p_Var2;
        }
        if (p_Var22 == p_Var2) {
          local_458[0]._M_dataplus._M_p._0_4_ = pSVar16->seq_parameter_set_id;
          local_458[0]._M_string_length = (size_type)pSVar16;
          std::
          _Rb_tree<unsigned_int,std::pair<unsigned_int_const,SPSUnit*>,std::_Select1st<std::pair<unsigned_int_const,SPSUnit*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,SPSUnit*>>>
          ::_M_emplace_unique<std::pair<unsigned_int,SPSUnit*>>
                    (local_4a8,(pair<unsigned_int,_SPSUnit_*> *)local_458);
          iVar12 = 5;
          if (local_4f0 == 0) {
            SPSUnit::getStreamDescr_abi_cxx11_(local_458,pSVar16);
            std::__cxx11::string::operator=((string *)&local_4f8,(string *)local_458);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_458[0]._M_dataplus._M_p != paVar4) {
              operator_delete(local_458[0]._M_dataplus._M_p,
                              local_458[0].field_2._M_allocated_capacity + 1);
            }
          }
        }
        else {
          SPSUnit::~SPSUnit(pSVar16);
          uVar24 = 0x200;
LAB_00185984:
          operator_delete(pSVar16,uVar24);
LAB_0018598c:
          iVar12 = 5;
        }
      }
      else {
        SPSUnit::~SPSUnit(pSVar16);
        uVar24 = 0x200;
LAB_001857f6:
        operator_delete(pSVar16,uVar24);
        bVar11 = true;
        iVar12 = 1;
      }
LAB_00185991:
      if (iVar13 == 0) goto switchD_0018550f_caseD_9;
    }
LAB_00185998:
    puVar19 = local_488;
    if (iVar12 != 0) goto LAB_00185b2d;
    buffer_00 = NALUnit::findNextNAL(buffer_00,local_488);
  } while( true );
}

Assistant:

CheckStreamRez H264StreamReader::checkStream(uint8_t *buffer, int len)
{
    SEIUnit lastSEI;
    SliceUnit slice;
    CheckStreamRez rez;
    uint8_t *end = buffer + len;
    std::string tmpDescr;
    bool pulldownInserted = false;
    bool offsetsInserted = false;

    for (uint8_t *nal = NALUnit::findNextNAL(buffer, end); nal < end - 4; nal = NALUnit::findNextNAL(nal, end))
    {
        if (*nal & 0x80)
            return rez;
        auto nalType = static_cast<NALUnit::NALType>(*nal & 0x1f);
        const uint8_t *nextNal = NALUnit::findNALWithStartCode(nal, end, true);
        if (!m_eof && nextNal == end)
            break;

        switch (nalType)
        {
        case NALUnit::NALType::nuSubSPS:
            m_mvcSubStream = true;
            [[fallthrough]];
        case NALUnit::NALType::nuSPS:
        {
            if (nalType == NALUnit::NALType::nuSPS)
                m_mvcPrimaryStream = true;
            auto sps = new SPSUnit();
            sps->decodeBuffer(nal, nextNal);
            if (sps->deserialize() != 0)
            {
                delete sps;
                return rez;
            }
            if (m_spsMap.find(sps->seq_parameter_set_id) != m_spsMap.end())
            {
                delete sps;
                break;
            }
            m_spsMap.insert(make_pair(sps->seq_parameter_set_id, sps));
            if (tmpDescr.empty())
                tmpDescr = sps->getStreamDescr();
            break;
        }
        case NALUnit::NALType::nuPPS:
        {
            auto pps = new PPSUnit();
            pps->decodeBuffer(nal, nextNal);
            if (pps->deserialize() != 0)
            {
                delete pps;
                return rez;
            }
            if (m_spsMap.find(pps->seq_parameter_set_id) == m_spsMap.end() ||
                m_ppsMap.find(pps->pic_parameter_set_id) != m_ppsMap.end())
            {
                delete pps;
                break;
            }
            m_ppsMap.insert(make_pair(pps->pic_parameter_set_id, pps));
            break;
        }
        case NALUnit::NALType::nuSEI:
            if (!m_spsMap.empty())
            {
                SPSUnit *sps = m_spsMap.begin()->second;
                lastSEI.decodeBuffer(nal, nextNal);
                lastSEI.deserialize(*sps, sps->nalHrdParams.isPresent || sps->vclHrdParams.isPresent);
                if (lastSEI.pic_struct == 5 || lastSEI.pic_struct == 6 || lastSEI.pic_struct == 7 ||
                    lastSEI.pic_struct == 8)
                {
                    if (!pulldownInserted)
                    {
                        pulldownInserted = true;
                        tmpDescr = sps->getStreamDescr();
                        tmpDescr += " (pulldown)";
                    }
                }
                if (!offsetsInserted && lastSEI.number_of_offset_sequences >= 0)
                {
                    offsetsInserted = true;
                    tmpDescr += "  3d-pg-planes: " + int32ToStr(lastSEI.number_of_offset_sequences);
                }
            }
            break;

        case NALUnit::NALType::nuSliceIDR:
            // m_openGOP = false;
        case NALUnit::NALType::nuSliceNonIDR:
        case NALUnit::NALType::nuSliceA:
        case NALUnit::NALType::nuSliceB:
        case NALUnit::NALType::nuSliceC:
        case NALUnit::NALType::nuSliceExt:
            if (m_ppsMap.empty() || m_spsMap.empty())
                break;
            try
            {
                uint8_t tmpBuffer[512];
                int toDecode = static_cast<int>(FFMIN(sizeof(tmpBuffer) - 8, nextNal - nal));
                int decodedLen = SliceUnit::decodeNAL(nal, nal + toDecode, tmpBuffer, sizeof(tmpBuffer));
                int nalRez = slice.deserialize(tmpBuffer, tmpBuffer + decodedLen, m_spsMap, m_ppsMap);
                if (nalRez != 0)
                    return rez;

                if (m_mvcSubStream)
                    rez.codecInfo = h264DepCodecInfo;
                else
                    rez.codecInfo = h264CodecInfo;
                rez.streamDescr = tmpDescr;
            }
            catch (BitStreamException &e)
            {
                (void)e;
                return rez;
            }
            break;
        default:
            break;
        }
    }
    if (m_mvcSubStream && m_mvcPrimaryStream)
        rez.multiSubStream = true;

    return rez;
}